

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
          (ImmutableMapFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  _func_int **in_RSI;
  ImmutableFieldGenerator *in_RDI;
  FieldDescriptor *in_stack_00000008;
  Context *in_stack_00000010;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000c60;
  Context *in_stack_00000c68;
  FieldGeneratorInfo *in_stack_00000c70;
  int in_stack_00000c78;
  int in_stack_00000c7c;
  FieldDescriptor *in_stack_00000c80;
  
  ImmutableFieldGenerator::ImmutableFieldGenerator(in_RDI);
  in_RDI->_vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutableMapFieldGenerator_00896fe8;
  in_RDI[1]._vptr_ImmutableFieldGenerator = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x584730);
  pCVar1 = Context::GetNameResolver((Context *)0x584748);
  in_RDI[8]._vptr_ImmutableFieldGenerator = (_func_int **)pCVar1;
  Context::GetFieldGeneratorInfo(in_stack_00000010,in_stack_00000008);
  anon_unknown_5::SetMessageVariables
            (in_stack_00000c80,in_stack_00000c7c,in_stack_00000c78,in_stack_00000c70,
             in_stack_00000c68,in_stack_00000c60);
  return;
}

Assistant:

ImmutableMapFieldGenerator::ImmutableMapFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}